

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_16777232,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMiMBIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_true> *tray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  float fVar3;
  undefined4 uVar4;
  RTCFilterFunctionN p_Var5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  int iVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  Geometry *pGVar28;
  ulong uVar29;
  ulong uVar30;
  Scene *pSVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  ulong uVar36;
  bool bVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [64];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [64];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar103;
  float fVar106;
  float fVar107;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  float fVar108;
  float fVar109;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar110 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [64];
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  undefined1 local_c31;
  undefined1 local_c30 [16];
  undefined8 local_c20;
  float fStack_c18;
  float fStack_c14;
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined1 local_bf0 [16];
  size_t local_bd8;
  RayK<8> *local_bd0;
  Scene *local_bc8;
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b80 [16];
  undefined1 local_b70 [16];
  undefined1 local_b60 [16];
  undefined1 local_b50 [16];
  long local_b38;
  ulong local_b30;
  ulong *local_b28;
  long local_b20;
  ulong local_b18;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [16];
  undefined1 local_ab0 [16];
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  float local_a90;
  float fStack_a8c;
  float fStack_a88;
  float fStack_a84;
  float local_a80;
  float fStack_a7c;
  float fStack_a78;
  float fStack_a74;
  float local_a70;
  float fStack_a6c;
  float fStack_a68;
  float fStack_a64;
  float local_a60;
  float fStack_a5c;
  float fStack_a58;
  float fStack_a54;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  float local_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 *local_9c0;
  undefined1 local_9b0 [16];
  undefined1 local_9a0 [16];
  undefined1 local_990 [16];
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  undefined1 local_950 [16];
  undefined1 local_940 [32];
  RTCHitN local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined4 local_8a0;
  undefined4 uStack_89c;
  undefined4 uStack_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 uStack_888;
  undefined4 uStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  local_b28 = local_7f8;
  local_800 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar82 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar90 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x40);
  auVar95 = ZEXT1664(CONCAT412(uVar2,CONCAT48(uVar2,CONCAT44(uVar2,uVar2))));
  local_a80 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_a90 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_aa0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x40);
  local_a50 = local_a80 * 0.99999964;
  local_a60 = local_a90 * 0.99999964;
  local_a70 = local_aa0 * 0.99999964;
  local_a80 = local_a80 * 1.0000004;
  local_a90 = local_a90 * 1.0000004;
  local_aa0 = local_aa0 * 1.0000004;
  local_b30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_b18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar25 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  uVar34 = local_b30 ^ 0x10;
  uVar36 = local_b18 ^ 0x10;
  iVar15 = (tray->tnear).field_0.i[k];
  auVar110 = ZEXT1664(CONCAT412(iVar15,CONCAT48(iVar15,CONCAT44(iVar15,iVar15))));
  iVar15 = (tray->tfar).field_0.i[k];
  auVar115 = ZEXT1664(CONCAT412(iVar15,CONCAT48(iVar15,CONCAT44(iVar15,iVar15))));
  iVar15 = 1 << ((uint)k & 0x1f);
  auVar46._4_4_ = iVar15;
  auVar46._0_4_ = iVar15;
  auVar46._8_4_ = iVar15;
  auVar46._12_4_ = iVar15;
  auVar46._16_4_ = iVar15;
  auVar46._20_4_ = iVar15;
  auVar46._24_4_ = iVar15;
  auVar46._28_4_ = iVar15;
  auVar14 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar46 = vpand_avx2(auVar46,auVar14);
  local_940 = vpcmpeqd_avx2(auVar46,auVar14);
  bVar38 = true;
  fStack_a4c = local_a50;
  fStack_a48 = local_a50;
  fStack_a44 = local_a50;
  fStack_a5c = local_a60;
  fStack_a58 = local_a60;
  fStack_a54 = local_a60;
  fStack_a6c = local_a70;
  fStack_a68 = local_a70;
  fStack_a64 = local_a70;
  fStack_a7c = local_a80;
  fStack_a78 = local_a80;
  fStack_a74 = local_a80;
  fStack_a8c = local_a90;
  fStack_a88 = local_a90;
  fStack_a84 = local_a90;
  fStack_a9c = local_aa0;
  fStack_a98 = local_aa0;
  fStack_a94 = local_aa0;
  do {
    uVar35 = local_b28[-1];
    local_b28 = local_b28 + -1;
    while( true ) {
      local_a20 = auVar82._0_16_;
      local_ab0 = auVar110._0_16_;
      local_a30 = auVar90._0_16_;
      local_a40 = auVar95._0_16_;
      local_ac0 = auVar115._0_16_;
      if ((uVar35 & 8) != 0) break;
      uVar16 = uVar35 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4 + 0xe0);
      auVar39._4_4_ = uVar2;
      auVar39._0_4_ = uVar2;
      auVar39._8_4_ = uVar2;
      auVar39._12_4_ = uVar2;
      auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + local_b30),auVar39,
                                *(undefined1 (*) [16])(uVar16 + 0x20 + local_b30));
      auVar40 = vsubps_avx(auVar40,local_a20);
      auVar47._0_4_ = local_a50 * auVar40._0_4_;
      auVar47._4_4_ = fStack_a4c * auVar40._4_4_;
      auVar47._8_4_ = fStack_a48 * auVar40._8_4_;
      auVar47._12_4_ = fStack_a44 * auVar40._12_4_;
      auVar40 = vmaxps_avx(local_ab0,auVar47);
      auVar85 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + local_b18),auVar39,
                                *(undefined1 (*) [16])(uVar16 + 0x20 + local_b18));
      auVar85 = vsubps_avx(auVar85,local_a30);
      auVar53._0_4_ = local_a60 * auVar85._0_4_;
      auVar53._4_4_ = fStack_a5c * auVar85._4_4_;
      auVar53._8_4_ = fStack_a58 * auVar85._8_4_;
      auVar53._12_4_ = fStack_a54 * auVar85._12_4_;
      auVar85 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar25),auVar39,
                                *(undefined1 (*) [16])(uVar16 + 0x20 + uVar25));
      auVar85 = vsubps_avx(auVar85,local_a40);
      auVar63._0_4_ = local_a70 * auVar85._0_4_;
      auVar63._4_4_ = fStack_a6c * auVar85._4_4_;
      auVar63._8_4_ = fStack_a68 * auVar85._8_4_;
      auVar63._12_4_ = fStack_a64 * auVar85._12_4_;
      auVar85 = vmaxps_avx(auVar53,auVar63);
      auVar40 = vmaxps_avx(auVar40,auVar85);
      auVar85 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar34),auVar39,
                                *(undefined1 (*) [16])(uVar16 + 0x20 + uVar34));
      auVar85 = vsubps_avx(auVar85,local_a20);
      auVar54._0_4_ = local_a80 * auVar85._0_4_;
      auVar54._4_4_ = fStack_a7c * auVar85._4_4_;
      auVar54._8_4_ = fStack_a78 * auVar85._8_4_;
      auVar54._12_4_ = fStack_a74 * auVar85._12_4_;
      auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + uVar36),auVar39,
                                *(undefined1 (*) [16])(uVar16 + 0x20 + uVar36));
      auVar85 = vminps_avx(local_ac0,auVar54);
      auVar57 = vsubps_avx(auVar57,local_a30);
      auVar64._0_4_ = local_a90 * auVar57._0_4_;
      auVar64._4_4_ = fStack_a8c * auVar57._4_4_;
      auVar64._8_4_ = fStack_a88 * auVar57._8_4_;
      auVar64._12_4_ = fStack_a84 * auVar57._12_4_;
      auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar16 + 0x80 + (uVar25 ^ 0x10)),auVar39,
                                *(undefined1 (*) [16])(uVar16 + 0x20 + (uVar25 ^ 0x10)));
      auVar57 = vsubps_avx(auVar57,local_a40);
      auVar70._0_4_ = local_aa0 * auVar57._0_4_;
      auVar70._4_4_ = fStack_a9c * auVar57._4_4_;
      auVar70._8_4_ = fStack_a98 * auVar57._8_4_;
      auVar70._12_4_ = fStack_a94 * auVar57._12_4_;
      auVar57 = vminps_avx(auVar64,auVar70);
      auVar85 = vminps_avx(auVar85,auVar57);
      if (((uint)uVar35 & 7) == 6) {
        auVar85 = vcmpps_avx(auVar40,auVar85,2);
        auVar40 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0xe0),auVar39,2);
        auVar57 = vcmpps_avx(auVar39,*(undefined1 (*) [16])(uVar16 + 0xf0),1);
        auVar40 = vandps_avx(auVar40,auVar57);
        auVar40 = vandps_avx(auVar40,auVar85);
      }
      else {
        auVar40 = vcmpps_avx(auVar40,auVar85,2);
      }
      auVar40 = vpslld_avx(auVar40,0x1f);
      uVar22 = vmovmskps_avx(auVar40);
      if (uVar22 == 0) goto LAB_0056cfee;
      lVar23 = 0;
      for (uVar35 = (ulong)(byte)uVar22; (uVar35 & 1) == 0;
          uVar35 = uVar35 >> 1 | 0x8000000000000000) {
        lVar23 = lVar23 + 1;
      }
      uVar35 = *(ulong *)(uVar16 + lVar23 * 8);
      uVar22 = (uVar22 & 0xff) - 1 & uVar22 & 0xff;
      uVar26 = (ulong)uVar22;
      if (uVar22 != 0) {
        *local_b28 = uVar35;
        lVar23 = 0;
        for (; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
          lVar23 = lVar23 + 1;
        }
        uVar22 = uVar22 - 1 & uVar22;
        uVar26 = (ulong)uVar22;
        bVar37 = uVar22 == 0;
        while( true ) {
          local_b28 = local_b28 + 1;
          uVar35 = *(ulong *)(uVar16 + lVar23 * 8);
          if (bVar37) break;
          *local_b28 = uVar35;
          lVar23 = 0;
          for (uVar35 = uVar26; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
            lVar23 = lVar23 + 1;
          }
          uVar26 = uVar26 - 1 & uVar26;
          bVar37 = uVar26 == 0;
        }
      }
    }
    local_b38 = (ulong)((uint)uVar35 & 0xf) - 8;
    if (local_b38 != 0) {
      uVar35 = uVar35 & 0xfffffffffffffff0;
      local_b20 = 0;
      local_bd8 = k;
      local_bd0 = ray;
      do {
        lVar24 = local_b20 * 0x50;
        pSVar31 = context->scene;
        pGVar28 = (pSVar31->geometries).items[*(uint *)(uVar35 + 0x30 + lVar24)].ptr;
        fVar3 = (pGVar28->time_range).lower;
        fVar3 = pGVar28->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar3) / ((pGVar28->time_range).upper - fVar3));
        auVar40 = vroundss_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),9);
        auVar40 = vminss_avx(auVar40,ZEXT416((uint)(pGVar28->fnumTimeSegments + -1.0)));
        auVar49 = vmaxss_avx(ZEXT816(0),auVar40);
        lVar17 = (long)(int)auVar49._0_4_ * 0x38;
        uVar33 = (ulong)*(uint *)(uVar35 + 4 + lVar24);
        lVar23 = *(long *)(*(long *)&pGVar28[2].numPrimitives + lVar17);
        lVar17 = *(long *)(*(long *)&pGVar28[2].numPrimitives + 0x38 + lVar17);
        auVar40 = *(undefined1 (*) [16])(lVar23 + (ulong)*(uint *)(uVar35 + lVar24) * 4);
        uVar27 = (ulong)*(uint *)(uVar35 + 0x10 + lVar24);
        auVar85 = *(undefined1 (*) [16])(lVar23 + uVar27 * 4);
        uVar16 = (ulong)*(uint *)(uVar35 + 0x20 + lVar24);
        auVar66 = *(undefined1 (*) [16])(lVar23 + uVar16 * 4);
        auVar57 = *(undefined1 (*) [16])(lVar23 + uVar33 * 4);
        uVar26 = (ulong)*(uint *)(uVar35 + 0x14 + lVar24);
        auVar68 = *(undefined1 (*) [16])(lVar23 + uVar26 * 4);
        uVar18 = (ulong)*(uint *)(uVar35 + 0x24 + lVar24);
        auVar65 = *(undefined1 (*) [16])(lVar23 + uVar18 * 4);
        uVar32 = (ulong)*(uint *)(uVar35 + 8 + lVar24);
        auVar91 = *(undefined1 (*) [16])(lVar23 + uVar32 * 4);
        uVar19 = (ulong)*(uint *)(uVar35 + 0x18 + lVar24);
        auVar51 = *(undefined1 (*) [16])(lVar23 + uVar19 * 4);
        uVar29 = (ulong)*(uint *)(uVar35 + 0x28 + lVar24);
        auVar48 = *(undefined1 (*) [16])(lVar23 + uVar29 * 4);
        uVar30 = (ulong)*(uint *)(uVar35 + 0xc + lVar24);
        auVar72 = *(undefined1 (*) [16])(lVar23 + uVar30 * 4);
        uVar20 = (ulong)*(uint *)(uVar35 + 0x1c + lVar24);
        auVar50 = *(undefined1 (*) [16])(lVar23 + uVar20 * 4);
        uVar21 = (ulong)*(uint *)(uVar35 + 0x2c + lVar24);
        auVar41 = *(undefined1 (*) [16])(lVar23 + uVar21 * 4);
        auVar42 = *(undefined1 (*) [16])(lVar17 + (ulong)*(uint *)(uVar35 + lVar24) * 4);
        auVar43 = *(undefined1 (*) [16])(lVar17 + uVar27 * 4);
        fVar3 = fVar3 - auVar49._0_4_;
        auVar49 = vunpcklps_avx(auVar40,auVar91);
        auVar91 = vunpckhps_avx(auVar40,auVar91);
        auVar55 = vunpcklps_avx(auVar57,auVar72);
        auVar57 = vunpckhps_avx(auVar57,auVar72);
        auVar40 = *(undefined1 (*) [16])(lVar17 + uVar33 * 4);
        auVar56 = vunpcklps_avx(auVar91,auVar57);
        auVar58 = vunpcklps_avx(auVar49,auVar55);
        auVar91 = vunpckhps_avx(auVar49,auVar55);
        auVar72 = vunpcklps_avx(auVar85,auVar51);
        auVar57 = vunpckhps_avx(auVar85,auVar51);
        auVar51 = vunpcklps_avx(auVar68,auVar50);
        auVar68 = vunpckhps_avx(auVar68,auVar50);
        auVar85 = *(undefined1 (*) [16])(lVar17 + uVar32 * 4);
        auVar50 = vunpcklps_avx(auVar57,auVar68);
        auVar49 = vunpcklps_avx(auVar72,auVar51);
        auVar68 = vunpckhps_avx(auVar72,auVar51);
        auVar72 = vunpcklps_avx(auVar66,auVar48);
        auVar51 = vunpckhps_avx(auVar66,auVar48);
        auVar55 = vunpcklps_avx(auVar65,auVar41);
        auVar48 = vunpckhps_avx(auVar65,auVar41);
        auVar57 = *(undefined1 (*) [16])(lVar17 + uVar30 * 4);
        auVar41 = vunpcklps_avx(auVar51,auVar48);
        auVar66 = vunpcklps_avx(auVar72,auVar55);
        auVar51 = vunpckhps_avx(auVar72,auVar55);
        auVar48 = vunpcklps_avx(auVar42,auVar85);
        auVar85 = vunpckhps_avx(auVar42,auVar85);
        auVar72 = vunpcklps_avx(auVar40,auVar57);
        auVar57 = vunpckhps_avx(auVar40,auVar57);
        auVar40 = *(undefined1 (*) [16])(lVar17 + uVar19 * 4);
        auVar42 = vunpcklps_avx(auVar85,auVar57);
        auVar55 = vunpcklps_avx(auVar48,auVar72);
        auVar57 = vunpckhps_avx(auVar48,auVar72);
        auVar72 = vunpcklps_avx(auVar43,auVar40);
        auVar48 = vunpckhps_avx(auVar43,auVar40);
        auVar40 = *(undefined1 (*) [16])(lVar17 + uVar26 * 4);
        auVar85 = *(undefined1 (*) [16])(lVar17 + uVar20 * 4);
        auVar43 = vunpcklps_avx(auVar40,auVar85);
        auVar40 = vunpckhps_avx(auVar40,auVar85);
        auVar65 = vunpcklps_avx(auVar48,auVar40);
        auVar67 = vunpcklps_avx(auVar72,auVar43);
        auVar48 = vunpckhps_avx(auVar72,auVar43);
        auVar40 = *(undefined1 (*) [16])(lVar17 + uVar16 * 4);
        auVar85 = *(undefined1 (*) [16])(lVar17 + uVar29 * 4);
        auVar43 = vunpcklps_avx(auVar40,auVar85);
        auVar72 = vunpckhps_avx(auVar40,auVar85);
        auVar40 = *(undefined1 (*) [16])(lVar17 + uVar18 * 4);
        auVar85 = *(undefined1 (*) [16])(lVar17 + uVar21 * 4);
        auVar71 = vunpcklps_avx(auVar40,auVar85);
        auVar40 = vunpckhps_avx(auVar40,auVar85);
        auVar85 = vunpcklps_avx(auVar72,auVar40);
        auVar72 = vunpcklps_avx(auVar43,auVar71);
        auVar40 = vunpckhps_avx(auVar43,auVar71);
        fVar12 = 1.0 - fVar3;
        auVar102._4_4_ = fVar12;
        auVar102._0_4_ = fVar12;
        auVar102._8_4_ = fVar12;
        auVar102._12_4_ = fVar12;
        auVar96._0_4_ = fVar3 * auVar55._0_4_;
        auVar96._4_4_ = fVar3 * auVar55._4_4_;
        auVar96._8_4_ = fVar3 * auVar55._8_4_;
        auVar96._12_4_ = fVar3 * auVar55._12_4_;
        auVar43 = vfmadd231ps_fma(auVar96,auVar102,auVar58);
        auVar83._0_4_ = fVar3 * auVar57._0_4_;
        auVar83._4_4_ = fVar3 * auVar57._4_4_;
        auVar83._8_4_ = fVar3 * auVar57._8_4_;
        auVar83._12_4_ = fVar3 * auVar57._12_4_;
        auVar57 = vfmadd231ps_fma(auVar83,auVar102,auVar91);
        auVar91._0_4_ = fVar3 * auVar42._0_4_;
        auVar91._4_4_ = fVar3 * auVar42._4_4_;
        auVar91._8_4_ = fVar3 * auVar42._8_4_;
        auVar91._12_4_ = fVar3 * auVar42._12_4_;
        auVar91 = vfmadd231ps_fma(auVar91,auVar102,auVar56);
        auVar97._0_4_ = fVar3 * auVar67._0_4_;
        auVar97._4_4_ = fVar3 * auVar67._4_4_;
        auVar97._8_4_ = fVar3 * auVar67._8_4_;
        auVar97._12_4_ = fVar3 * auVar67._12_4_;
        auVar42 = vfmadd231ps_fma(auVar97,auVar102,auVar49);
        auVar71._0_4_ = fVar3 * auVar48._0_4_;
        auVar71._4_4_ = fVar3 * auVar48._4_4_;
        auVar71._8_4_ = fVar3 * auVar48._8_4_;
        auVar71._12_4_ = fVar3 * auVar48._12_4_;
        auVar68 = vfmadd231ps_fma(auVar71,auVar102,auVar68);
        puVar1 = (undefined8 *)(uVar35 + 0x30 + lVar24);
        local_a00 = *puVar1;
        uStack_9f8 = puVar1[1];
        puVar1 = (undefined8 *)(uVar35 + 0x40 + lVar24);
        auVar48._0_4_ = fVar3 * auVar65._0_4_;
        auVar48._4_4_ = fVar3 * auVar65._4_4_;
        auVar48._8_4_ = fVar3 * auVar65._8_4_;
        auVar48._12_4_ = fVar3 * auVar65._12_4_;
        auVar48 = vfmadd231ps_fma(auVar48,auVar102,auVar50);
        auVar55._0_4_ = fVar3 * auVar72._0_4_;
        auVar55._4_4_ = fVar3 * auVar72._4_4_;
        auVar55._8_4_ = fVar3 * auVar72._8_4_;
        auVar55._12_4_ = fVar3 * auVar72._12_4_;
        auVar65._0_4_ = fVar3 * auVar40._0_4_;
        auVar65._4_4_ = fVar3 * auVar40._4_4_;
        auVar65._8_4_ = fVar3 * auVar40._8_4_;
        auVar65._12_4_ = fVar3 * auVar40._12_4_;
        auVar40._0_4_ = fVar3 * auVar85._0_4_;
        auVar40._4_4_ = fVar3 * auVar85._4_4_;
        auVar40._8_4_ = fVar3 * auVar85._8_4_;
        auVar40._12_4_ = fVar3 * auVar85._12_4_;
        auVar72 = vfmadd231ps_fma(auVar55,auVar102,auVar66);
        auVar51 = vfmadd231ps_fma(auVar65,auVar102,auVar51);
        auVar50 = vfmadd231ps_fma(auVar40,auVar102,auVar41);
        local_a10 = *puVar1;
        uStack_a08 = puVar1[1];
        uVar2 = *(undefined4 *)(local_bd0 + local_bd8 * 4);
        auVar41._4_4_ = uVar2;
        auVar41._0_4_ = uVar2;
        auVar41._8_4_ = uVar2;
        auVar41._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(local_bd0 + local_bd8 * 4 + 0x20);
        auVar101._4_4_ = uVar2;
        auVar101._0_4_ = uVar2;
        auVar101._8_4_ = uVar2;
        auVar101._12_4_ = uVar2;
        uVar2 = *(undefined4 *)(local_bd0 + local_bd8 * 4 + 0x40);
        auVar104._4_4_ = uVar2;
        auVar104._0_4_ = uVar2;
        auVar104._8_4_ = uVar2;
        auVar104._12_4_ = uVar2;
        local_bf0 = vsubps_avx(auVar43,auVar41);
        local_c00 = vsubps_avx(auVar57,auVar101);
        local_b50 = vsubps_avx(auVar91,auVar104);
        auVar40 = vsubps_avx(auVar42,auVar41);
        auVar85 = vsubps_avx(auVar68,auVar101);
        auVar57 = vsubps_avx(auVar48,auVar104);
        auVar68 = vsubps_avx(auVar72,auVar41);
        auVar91 = vsubps_avx(auVar51,auVar101);
        auVar51 = vsubps_avx(auVar50,auVar104);
        local_b60 = vsubps_avx(auVar68,local_bf0);
        auVar48 = vsubps_avx(auVar91,local_c00);
        local_bc0 = vsubps_avx(auVar51,local_b50);
        auVar42._0_4_ = local_bf0._0_4_ + auVar68._0_4_;
        auVar42._4_4_ = local_bf0._4_4_ + auVar68._4_4_;
        auVar42._8_4_ = local_bf0._8_4_ + auVar68._8_4_;
        auVar42._12_4_ = local_bf0._12_4_ + auVar68._12_4_;
        auVar66._0_4_ = auVar91._0_4_ + local_c00._0_4_;
        auVar66._4_4_ = auVar91._4_4_ + local_c00._4_4_;
        auVar66._8_4_ = auVar91._8_4_ + local_c00._8_4_;
        auVar66._12_4_ = auVar91._12_4_ + local_c00._12_4_;
        fVar3 = local_b50._0_4_;
        auVar72._0_4_ = auVar51._0_4_ + fVar3;
        fVar12 = local_b50._4_4_;
        auVar72._4_4_ = auVar51._4_4_ + fVar12;
        fVar6 = local_b50._8_4_;
        auVar72._8_4_ = auVar51._8_4_ + fVar6;
        fVar7 = local_b50._12_4_;
        auVar72._12_4_ = auVar51._12_4_ + fVar7;
        auVar105._0_4_ = local_bc0._0_4_ * auVar66._0_4_;
        auVar105._4_4_ = local_bc0._4_4_ * auVar66._4_4_;
        auVar105._8_4_ = local_bc0._8_4_ * auVar66._8_4_;
        auVar105._12_4_ = local_bc0._12_4_ * auVar66._12_4_;
        auVar50 = vfmsub231ps_fma(auVar105,auVar48,auVar72);
        auVar73._0_4_ = local_b60._0_4_ * auVar72._0_4_;
        auVar73._4_4_ = local_b60._4_4_ * auVar72._4_4_;
        auVar73._8_4_ = local_b60._8_4_ * auVar72._8_4_;
        auVar73._12_4_ = local_b60._12_4_ * auVar72._12_4_;
        auVar72 = vfmsub231ps_fma(auVar73,local_bc0,auVar42);
        auVar43._0_4_ = auVar48._0_4_ * auVar42._0_4_;
        auVar43._4_4_ = auVar48._4_4_ * auVar42._4_4_;
        auVar43._8_4_ = auVar48._8_4_ * auVar42._8_4_;
        auVar43._12_4_ = auVar48._12_4_ * auVar42._12_4_;
        auVar41 = vfmsub231ps_fma(auVar43,local_b60,auVar66);
        local_c20._4_4_ = *(float *)(local_bd0 + local_bd8 * 4 + 0xc0);
        auVar67._0_4_ = local_c20._4_4_ * auVar41._0_4_;
        auVar67._4_4_ = local_c20._4_4_ * auVar41._4_4_;
        auVar67._8_4_ = local_c20._4_4_ * auVar41._8_4_;
        auVar67._12_4_ = local_c20._4_4_ * auVar41._12_4_;
        uVar2 = *(undefined4 *)(local_bd0 + local_bd8 * 4 + 0xa0);
        auVar114._4_4_ = uVar2;
        auVar114._0_4_ = uVar2;
        auVar114._8_4_ = uVar2;
        auVar114._12_4_ = uVar2;
        auVar72 = vfmadd231ps_fma(auVar67,auVar114,auVar72);
        uVar2 = *(undefined4 *)(local_bd0 + local_bd8 * 4 + 0x80);
        auVar98._4_4_ = uVar2;
        auVar98._0_4_ = uVar2;
        auVar98._8_4_ = uVar2;
        auVar98._12_4_ = uVar2;
        local_ba0 = vfmadd231ps_fma(auVar72,auVar98,auVar50);
        local_b70 = vsubps_avx(local_c00,auVar85);
        local_b80 = vsubps_avx(local_b50,auVar57);
        auVar49._0_4_ = local_c00._0_4_ + auVar85._0_4_;
        auVar49._4_4_ = local_c00._4_4_ + auVar85._4_4_;
        auVar49._8_4_ = local_c00._8_4_ + auVar85._8_4_;
        auVar49._12_4_ = local_c00._12_4_ + auVar85._12_4_;
        auVar74._0_4_ = auVar57._0_4_ + fVar3;
        auVar74._4_4_ = auVar57._4_4_ + fVar12;
        auVar74._8_4_ = auVar57._8_4_ + fVar6;
        auVar74._12_4_ = auVar57._12_4_ + fVar7;
        fVar8 = local_b80._0_4_;
        auVar84._0_4_ = auVar49._0_4_ * fVar8;
        fVar9 = local_b80._4_4_;
        auVar84._4_4_ = auVar49._4_4_ * fVar9;
        fVar10 = local_b80._8_4_;
        auVar84._8_4_ = auVar49._8_4_ * fVar10;
        fVar11 = local_b80._12_4_;
        auVar84._12_4_ = auVar49._12_4_ * fVar11;
        auVar50 = vfmsub231ps_fma(auVar84,local_b70,auVar74);
        local_b90 = vsubps_avx(local_bf0,auVar40);
        fVar103 = local_b90._0_4_;
        auVar92._0_4_ = fVar103 * auVar74._0_4_;
        fVar106 = local_b90._4_4_;
        auVar92._4_4_ = fVar106 * auVar74._4_4_;
        fVar107 = local_b90._8_4_;
        auVar92._8_4_ = fVar107 * auVar74._8_4_;
        fVar108 = local_b90._12_4_;
        auVar92._12_4_ = fVar108 * auVar74._12_4_;
        auVar75._0_4_ = local_bf0._0_4_ + auVar40._0_4_;
        auVar75._4_4_ = local_bf0._4_4_ + auVar40._4_4_;
        auVar75._8_4_ = local_bf0._8_4_ + auVar40._8_4_;
        auVar75._12_4_ = local_bf0._12_4_ + auVar40._12_4_;
        auVar72 = vfmsub231ps_fma(auVar92,local_b80,auVar75);
        fVar109 = local_b70._0_4_;
        auVar76._0_4_ = fVar109 * auVar75._0_4_;
        fVar111 = local_b70._4_4_;
        auVar76._4_4_ = fVar111 * auVar75._4_4_;
        fVar112 = local_b70._8_4_;
        auVar76._8_4_ = fVar112 * auVar75._8_4_;
        fVar113 = local_b70._12_4_;
        auVar76._12_4_ = fVar113 * auVar75._12_4_;
        auVar41 = vfmsub231ps_fma(auVar76,local_b90,auVar49);
        auVar77._0_4_ = local_c20._4_4_ * auVar41._0_4_;
        auVar77._4_4_ = local_c20._4_4_ * auVar41._4_4_;
        auVar77._8_4_ = local_c20._4_4_ * auVar41._8_4_;
        auVar77._12_4_ = local_c20._4_4_ * auVar41._12_4_;
        auVar72 = vfmadd231ps_fma(auVar77,auVar114,auVar72);
        local_9e0 = vfmadd231ps_fma(auVar72,auVar98,auVar50);
        auVar72 = vsubps_avx(auVar40,auVar68);
        auVar56._0_4_ = auVar40._0_4_ + auVar68._0_4_;
        auVar56._4_4_ = auVar40._4_4_ + auVar68._4_4_;
        auVar56._8_4_ = auVar40._8_4_ + auVar68._8_4_;
        auVar56._12_4_ = auVar40._12_4_ + auVar68._12_4_;
        auVar68 = vsubps_avx(auVar85,auVar91);
        auVar50._0_4_ = auVar91._0_4_ + auVar85._0_4_;
        auVar50._4_4_ = auVar91._4_4_ + auVar85._4_4_;
        auVar50._8_4_ = auVar91._8_4_ + auVar85._8_4_;
        auVar50._12_4_ = auVar91._12_4_ + auVar85._12_4_;
        auVar91 = vsubps_avx(auVar57,auVar51);
        auVar78._0_4_ = auVar57._0_4_ + auVar51._0_4_;
        auVar78._4_4_ = auVar57._4_4_ + auVar51._4_4_;
        auVar78._8_4_ = auVar57._8_4_ + auVar51._8_4_;
        auVar78._12_4_ = auVar57._12_4_ + auVar51._12_4_;
        auVar85._0_4_ = auVar91._0_4_ * auVar50._0_4_;
        auVar85._4_4_ = auVar91._4_4_ * auVar50._4_4_;
        auVar85._8_4_ = auVar91._8_4_ * auVar50._8_4_;
        auVar85._12_4_ = auVar91._12_4_ * auVar50._12_4_;
        auVar85 = vfmsub231ps_fma(auVar85,auVar68,auVar78);
        auVar79._0_4_ = auVar78._0_4_ * auVar72._0_4_;
        auVar79._4_4_ = auVar78._4_4_ * auVar72._4_4_;
        auVar79._8_4_ = auVar78._8_4_ * auVar72._8_4_;
        auVar79._12_4_ = auVar78._12_4_ * auVar72._12_4_;
        auVar40 = vfmsub231ps_fma(auVar79,auVar91,auVar56);
        auVar57._0_4_ = auVar68._0_4_ * auVar56._0_4_;
        auVar57._4_4_ = auVar68._4_4_ * auVar56._4_4_;
        auVar57._8_4_ = auVar68._8_4_ * auVar56._8_4_;
        auVar57._12_4_ = auVar68._12_4_ * auVar56._12_4_;
        auVar57 = vfmsub231ps_fma(auVar57,auVar72,auVar50);
        local_c20._0_4_ = local_c20._4_4_;
        fStack_c18 = local_c20._4_4_;
        fStack_c14 = local_c20._4_4_;
        auVar58._0_4_ = local_c20._4_4_ * auVar57._0_4_;
        auVar58._4_4_ = local_c20._4_4_ * auVar57._4_4_;
        auVar58._8_4_ = local_c20._4_4_ * auVar57._8_4_;
        auVar58._12_4_ = local_c20._4_4_ * auVar57._12_4_;
        auVar40 = vfmadd231ps_fma(auVar58,auVar114,auVar40);
        auVar57 = vfmadd231ps_fma(auVar40,auVar98,auVar85);
        local_9f0 = local_ba0._0_4_;
        fStack_9ec = local_ba0._4_4_;
        fStack_9e8 = local_ba0._8_4_;
        fStack_9e4 = local_ba0._12_4_;
        local_9d0._0_4_ = auVar57._0_4_ + local_9f0 + local_9e0._0_4_;
        local_9d0._4_4_ = auVar57._4_4_ + fStack_9ec + local_9e0._4_4_;
        local_9d0._8_4_ = auVar57._8_4_ + fStack_9e8 + local_9e0._8_4_;
        local_9d0._12_4_ = auVar57._12_4_ + fStack_9e4 + local_9e0._12_4_;
        auVar51._8_4_ = 0x7fffffff;
        auVar51._0_8_ = 0x7fffffff7fffffff;
        auVar51._12_4_ = 0x7fffffff;
        auVar40 = vminps_avx(local_ba0,local_9e0);
        auVar40 = vminps_avx(auVar40,auVar57);
        local_bb0 = vandps_avx(local_9d0,auVar51);
        auVar93._0_4_ = local_bb0._0_4_ * 1.1920929e-07;
        auVar93._4_4_ = local_bb0._4_4_ * 1.1920929e-07;
        auVar93._8_4_ = local_bb0._8_4_ * 1.1920929e-07;
        auVar93._12_4_ = local_bb0._12_4_ * 1.1920929e-07;
        uVar16 = CONCAT44(auVar93._4_4_,auVar93._0_4_);
        auVar86._0_8_ = uVar16 ^ 0x8000000080000000;
        auVar86._8_4_ = -auVar93._8_4_;
        auVar86._12_4_ = -auVar93._12_4_;
        auVar40 = vcmpps_avx(auVar40,auVar86,5);
        auVar85 = vmaxps_avx(local_ba0,local_9e0);
        auVar85 = vmaxps_avx(auVar85,auVar57);
        auVar85 = vcmpps_avx(auVar85,auVar93,2);
        local_c10 = vorps_avx(auVar40,auVar85);
        k = local_bd8;
        ray = local_bd0;
        if ((((local_c10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (local_c10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (local_c10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            local_c10[0xf] < '\0') {
          auVar59._0_4_ = fVar109 * local_bc0._0_4_;
          auVar59._4_4_ = fVar111 * local_bc0._4_4_;
          auVar59._8_4_ = fVar112 * local_bc0._8_4_;
          auVar59._12_4_ = fVar113 * local_bc0._12_4_;
          auVar80._0_4_ = auVar48._0_4_ * fVar103;
          auVar80._4_4_ = auVar48._4_4_ * fVar106;
          auVar80._8_4_ = auVar48._8_4_ * fVar107;
          auVar80._12_4_ = auVar48._12_4_ * fVar108;
          auVar57 = vfmsub213ps_fma(auVar48,local_b80,auVar59);
          auVar87._0_4_ = auVar68._0_4_ * fVar8;
          auVar87._4_4_ = auVar68._4_4_ * fVar9;
          auVar87._8_4_ = auVar68._8_4_ * fVar10;
          auVar87._12_4_ = auVar68._12_4_ * fVar11;
          auVar94._0_4_ = auVar91._0_4_ * fVar103;
          auVar94._4_4_ = auVar91._4_4_ * fVar106;
          auVar94._8_4_ = auVar91._8_4_ * fVar107;
          auVar94._12_4_ = auVar91._12_4_ * fVar108;
          auVar91 = vfmsub213ps_fma(auVar91,local_b70,auVar87);
          auVar40 = vandps_avx(auVar59,auVar51);
          auVar85 = vandps_avx(auVar87,auVar51);
          auVar40 = vcmpps_avx(auVar40,auVar85,1);
          local_970 = vblendvps_avx(auVar91,auVar57,auVar40);
          auVar88._0_4_ = fVar109 * auVar72._0_4_;
          auVar88._4_4_ = fVar111 * auVar72._4_4_;
          auVar88._8_4_ = fVar112 * auVar72._8_4_;
          auVar88._12_4_ = fVar113 * auVar72._12_4_;
          auVar57 = vfmsub213ps_fma(auVar72,local_b80,auVar94);
          auVar60._0_4_ = local_b60._0_4_ * fVar8;
          auVar60._4_4_ = local_b60._4_4_ * fVar9;
          auVar60._8_4_ = local_b60._8_4_ * fVar10;
          auVar60._12_4_ = local_b60._12_4_ * fVar11;
          auVar91 = vfmsub213ps_fma(local_bc0,local_b90,auVar60);
          auVar40 = vandps_avx(auVar60,auVar51);
          auVar85 = vandps_avx(auVar94,auVar51);
          auVar40 = vcmpps_avx(auVar40,auVar85,1);
          local_960 = vblendvps_avx(auVar57,auVar91,auVar40);
          auVar57 = vfmsub213ps_fma(local_b60,local_b70,auVar80);
          auVar68 = vfmsub213ps_fma(auVar68,local_b90,auVar88);
          auVar40 = vandps_avx(auVar80,auVar51);
          auVar85 = vandps_avx(auVar88,auVar51);
          auVar40 = vcmpps_avx(auVar40,auVar85,1);
          local_950 = vblendvps_avx(auVar68,auVar57,auVar40);
          auVar68._0_4_ = local_950._0_4_ * local_c20._4_4_;
          auVar68._4_4_ = local_950._4_4_ * local_c20._4_4_;
          auVar68._8_4_ = local_950._8_4_ * local_c20._4_4_;
          auVar68._12_4_ = local_950._12_4_ * local_c20._4_4_;
          auVar40 = vfmadd213ps_fma(auVar114,local_960,auVar68);
          auVar40 = vfmadd213ps_fma(auVar98,local_970,auVar40);
          auVar81._0_4_ = auVar40._0_4_ + auVar40._0_4_;
          auVar81._4_4_ = auVar40._4_4_ + auVar40._4_4_;
          auVar81._8_4_ = auVar40._8_4_ + auVar40._8_4_;
          auVar81._12_4_ = auVar40._12_4_ + auVar40._12_4_;
          auVar69._0_4_ = local_950._0_4_ * fVar3;
          auVar69._4_4_ = local_950._4_4_ * fVar12;
          auVar69._8_4_ = local_950._8_4_ * fVar6;
          auVar69._12_4_ = local_950._12_4_ * fVar7;
          auVar40 = vfmadd213ps_fma(local_c00,local_960,auVar69);
          auVar85 = vfmadd213ps_fma(local_bf0,local_970,auVar40);
          auVar40 = vrcpps_avx(auVar81);
          auVar99._8_4_ = 0x3f800000;
          auVar99._0_8_ = 0x3f8000003f800000;
          auVar99._12_4_ = 0x3f800000;
          auVar57 = vfnmadd213ps_fma(auVar40,auVar81,auVar99);
          auVar40 = vfmadd132ps_fma(auVar57,auVar40,auVar40);
          local_980._0_4_ = (auVar85._0_4_ + auVar85._0_4_) * auVar40._0_4_;
          local_980._4_4_ = (auVar85._4_4_ + auVar85._4_4_) * auVar40._4_4_;
          local_980._8_4_ = (auVar85._8_4_ + auVar85._8_4_) * auVar40._8_4_;
          local_980._12_4_ = (auVar85._12_4_ + auVar85._12_4_) * auVar40._12_4_;
          uVar2 = *(undefined4 *)(local_bd0 + local_bd8 * 4 + 0x60);
          auVar89._4_4_ = uVar2;
          auVar89._0_4_ = uVar2;
          auVar89._8_4_ = uVar2;
          auVar89._12_4_ = uVar2;
          auVar40 = vcmpps_avx(auVar89,local_980,2);
          uVar2 = *(undefined4 *)(local_bd0 + local_bd8 * 4 + 0x100);
          auVar100._4_4_ = uVar2;
          auVar100._0_4_ = uVar2;
          auVar100._8_4_ = uVar2;
          auVar100._12_4_ = uVar2;
          auVar82 = ZEXT1664(auVar100);
          auVar85 = vcmpps_avx(local_980,auVar100,2);
          auVar40 = vandps_avx(auVar40,auVar85);
          auVar85 = local_c10 & auVar40;
          if ((((auVar85 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar85 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar85 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar85[0xf] < '\0') {
            auVar40 = vandps_avx(auVar40,local_c10);
            auVar85 = vcmpps_avx(auVar81,_DAT_01f7aa10,4);
            local_9b0 = vandps_avx(auVar40,auVar85);
            uVar22 = vmovmskps_avx(local_9b0);
            if (uVar22 != 0) {
              local_9c0 = &local_c31;
              auVar40 = vrcpps_avx(local_9d0);
              auVar61._8_4_ = 0x3f800000;
              auVar61._0_8_ = 0x3f8000003f800000;
              auVar61._12_4_ = 0x3f800000;
              auVar85 = vfnmadd213ps_fma(local_9d0,auVar40,auVar61);
              auVar85 = vfmadd132ps_fma(auVar85,auVar40,auVar40);
              auVar52._8_4_ = 0x219392ef;
              auVar52._0_8_ = 0x219392ef219392ef;
              auVar52._12_4_ = 0x219392ef;
              auVar40 = vcmpps_avx(local_bb0,auVar52,5);
              auVar40 = vandps_avx(auVar85,auVar40);
              auVar44._0_4_ = local_9f0 * auVar40._0_4_;
              auVar44._4_4_ = fStack_9ec * auVar40._4_4_;
              auVar44._8_4_ = fStack_9e8 * auVar40._8_4_;
              auVar44._12_4_ = fStack_9e4 * auVar40._12_4_;
              local_9a0 = vminps_avx(auVar44,auVar61);
              auVar45._0_4_ = auVar40._0_4_ * local_9e0._0_4_;
              auVar45._4_4_ = auVar40._4_4_ * local_9e0._4_4_;
              auVar45._8_4_ = auVar40._8_4_ * local_9e0._8_4_;
              auVar45._12_4_ = auVar40._12_4_ * local_9e0._12_4_;
              local_990 = vminps_avx(auVar45,auVar61);
              uVar16 = (ulong)(uVar22 & 0xff);
              local_bc8 = pSVar31;
              do {
                uVar26 = 0;
                for (uVar18 = uVar16; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000)
                {
                  uVar26 = uVar26 + 1;
                }
                uVar22 = *(uint *)((long)&local_a00 + uVar26 * 4);
                pGVar28 = (pSVar31->geometries).items[uVar22].ptr;
                if ((pGVar28->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                  uVar16 = uVar16 ^ 1L << (uVar26 & 0x3f);
                }
                else {
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar28->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_0056d004:
                    *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
                    return bVar38;
                  }
                  local_c20 = pGVar28;
                  uVar18 = (ulong)(uint)((int)uVar26 * 4);
                  local_8c0 = *(undefined4 *)(local_9a0 + uVar18);
                  local_8a0 = *(undefined4 *)(local_990 + uVar18);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_980 + uVar18);
                  local_b10.context = context->user;
                  uVar2 = *(undefined4 *)((long)&local_a10 + uVar18);
                  local_880._4_4_ = uVar2;
                  local_880._0_4_ = uVar2;
                  local_880._8_4_ = uVar2;
                  local_880._12_4_ = uVar2;
                  local_880._16_4_ = uVar2;
                  local_880._20_4_ = uVar2;
                  local_880._24_4_ = uVar2;
                  local_880._28_4_ = uVar2;
                  uVar2 = *(undefined4 *)(local_970 + uVar18);
                  uVar4 = *(undefined4 *)(local_960 + uVar18);
                  local_900._4_4_ = uVar4;
                  local_900._0_4_ = uVar4;
                  local_900._8_4_ = uVar4;
                  local_900._12_4_ = uVar4;
                  local_900._16_4_ = uVar4;
                  local_900._20_4_ = uVar4;
                  local_900._24_4_ = uVar4;
                  local_900._28_4_ = uVar4;
                  uVar4 = *(undefined4 *)(local_950 + uVar18);
                  local_8e0._4_4_ = uVar4;
                  local_8e0._0_4_ = uVar4;
                  local_8e0._8_4_ = uVar4;
                  local_8e0._12_4_ = uVar4;
                  local_8e0._16_4_ = uVar4;
                  local_8e0._20_4_ = uVar4;
                  local_8e0._24_4_ = uVar4;
                  local_8e0._28_4_ = uVar4;
                  local_860._4_4_ = uVar22;
                  local_860._0_4_ = uVar22;
                  local_860._8_4_ = uVar22;
                  local_860._12_4_ = uVar22;
                  local_860._16_4_ = uVar22;
                  local_860._20_4_ = uVar22;
                  local_860._24_4_ = uVar22;
                  local_860._28_4_ = uVar22;
                  local_920[0] = (RTCHitN)(char)uVar2;
                  local_920[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[4] = (RTCHitN)(char)uVar2;
                  local_920[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[8] = (RTCHitN)(char)uVar2;
                  local_920[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[0xc] = (RTCHitN)(char)uVar2;
                  local_920[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[0x10] = (RTCHitN)(char)uVar2;
                  local_920[0x11] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[0x12] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[0x13] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[0x14] = (RTCHitN)(char)uVar2;
                  local_920[0x15] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[0x16] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[0x17] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[0x18] = (RTCHitN)(char)uVar2;
                  local_920[0x19] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[0x1a] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[0x1b] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  local_920[0x1c] = (RTCHitN)(char)uVar2;
                  local_920[0x1d] = (RTCHitN)(char)((uint)uVar2 >> 8);
                  local_920[0x1e] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
                  local_920[0x1f] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
                  uStack_8bc = local_8c0;
                  uStack_8b8 = local_8c0;
                  uStack_8b4 = local_8c0;
                  uStack_8b0 = local_8c0;
                  uStack_8ac = local_8c0;
                  uStack_8a8 = local_8c0;
                  uStack_8a4 = local_8c0;
                  uStack_89c = local_8a0;
                  uStack_898 = local_8a0;
                  uStack_894 = local_8a0;
                  uStack_890 = local_8a0;
                  uStack_88c = local_8a0;
                  uStack_888 = local_8a0;
                  uStack_884 = local_8a0;
                  auVar46 = vpcmpeqd_avx2(local_860,local_860);
                  uStack_83c = (local_b10.context)->instID[0];
                  local_840 = uStack_83c;
                  uStack_838 = uStack_83c;
                  uStack_834 = uStack_83c;
                  uStack_830 = uStack_83c;
                  uStack_82c = uStack_83c;
                  uStack_828 = uStack_83c;
                  uStack_824 = uStack_83c;
                  uStack_81c = (local_b10.context)->instPrimID[0];
                  local_820 = uStack_81c;
                  uStack_818 = uStack_81c;
                  uStack_814 = uStack_81c;
                  uStack_810 = uStack_81c;
                  uStack_80c = uStack_81c;
                  uStack_808 = uStack_81c;
                  uStack_804 = uStack_81c;
                  local_ae0 = local_940;
                  local_b10.valid = (int *)local_ae0;
                  local_b10.geometryUserPtr = pGVar28->userPtr;
                  local_b10.hit = local_920;
                  local_b10.N = 8;
                  local_b10.ray = (RTCRayN *)ray;
                  if (pGVar28->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    local_c30 = auVar82._0_16_;
                    local_bf0._0_8_ = uVar16;
                    local_c00._0_8_ = uVar26;
                    auVar46 = ZEXT1632(auVar46._0_16_);
                    (*pGVar28->occlusionFilterN)(&local_b10);
                    auVar82 = ZEXT1664(local_c30);
                    auVar46 = vpcmpeqd_avx2(auVar46,auVar46);
                    k = local_bd8;
                    pGVar28 = local_c20;
                    pSVar31 = local_bc8;
                    ray = local_bd0;
                    uVar16 = local_bf0._0_8_;
                    uVar26 = local_c00._0_8_;
                  }
                  auVar13 = vpcmpeqd_avx2(local_ae0,_DAT_01faff00);
                  auVar14 = auVar46 & ~auVar13;
                  if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar14 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar14 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar14 >> 0x7f,0) == '\0') &&
                        (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar14 >> 0xbf,0) == '\0') &&
                      (auVar14 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar14[0x1f]) {
                    auVar13 = auVar13 ^ auVar46;
                  }
                  else {
                    p_Var5 = context->args->filter;
                    if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar28->field_8).field_0x2 & 0x40) != 0)))) {
                      local_c30 = auVar82._0_16_;
                      local_bf0._0_8_ = uVar16;
                      local_c00._0_8_ = uVar26;
                      auVar46 = ZEXT1632(auVar46._0_16_);
                      (*p_Var5)(&local_b10);
                      auVar82 = ZEXT1664(local_c30);
                      auVar46 = vpcmpeqd_avx2(auVar46,auVar46);
                      k = local_bd8;
                      pSVar31 = local_bc8;
                      ray = local_bd0;
                      uVar16 = local_bf0._0_8_;
                      uVar26 = local_c00._0_8_;
                    }
                    auVar14 = vpcmpeqd_avx2(local_ae0,_DAT_01faff00);
                    auVar13 = auVar14 ^ auVar46;
                    auVar62._8_4_ = 0xff800000;
                    auVar62._0_8_ = 0xff800000ff800000;
                    auVar62._12_4_ = 0xff800000;
                    auVar62._16_4_ = 0xff800000;
                    auVar62._20_4_ = 0xff800000;
                    auVar62._24_4_ = 0xff800000;
                    auVar62._28_4_ = 0xff800000;
                    auVar46 = vblendvps_avx(auVar62,*(undefined1 (*) [32])(local_b10.ray + 0x100),
                                            auVar14);
                    *(undefined1 (*) [32])(local_b10.ray + 0x100) = auVar46;
                  }
                  if ((((((((auVar13 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar13 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar13 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar13 >> 0x7f,0) != '\0') ||
                        (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar13 >> 0xbf,0) != '\0') ||
                      (auVar13 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar13[0x1f] < '\0') goto LAB_0056d004;
                  *(int *)(ray + k * 4 + 0x100) = auVar82._0_4_;
                  uVar16 = uVar16 ^ 1L << (uVar26 & 0x3f);
                }
              } while (uVar16 != 0);
            }
          }
        }
        local_b20 = local_b20 + 1;
        auVar82 = ZEXT1664(local_a20);
        auVar90 = ZEXT1664(local_a30);
        auVar95 = ZEXT1664(local_a40);
        auVar110 = ZEXT1664(local_ab0);
        auVar115 = ZEXT1664(local_ac0);
      } while (local_b20 != local_b38);
    }
LAB_0056cfee:
    bVar38 = local_b28 != &local_800;
    if (!bVar38) {
      return bVar38;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }